

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptControlDeclaration(HlslGrammar *this,TIntermNode **node)

{
  bool bVar1;
  TIntermNode *pTVar2;
  char *pcVar3;
  HlslParseContext *this_00;
  _func_int **pp_Var4;
  TIntermTyped *expressionNode;
  TAttributes attributes;
  HlslToken idToken;
  TType type;
  TIntermTyped *local_110;
  TAttributes local_108;
  HlslToken local_e8;
  TType local_b8;
  
  *node = (TIntermNode *)0x0;
  local_108.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
  local_108.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       &local_108.
        super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
        super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
        ._M_impl._M_node.super__List_node_base;
  local_108.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node._M_size = 0;
  local_108.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       local_108.
       super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  TType::TType(&local_b8,EbtVoid,EvqTemporary,1,0,0,false);
  local_e8.loc.name = (TString *)0x0;
  bVar1 = acceptFullySpecifiedType(this,&local_b8,(TIntermNode **)&local_e8,&local_108,false);
  if (bVar1) {
    if (local_108.
        super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
        super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
        ._M_impl._M_node._M_size != 0) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2e])(this->parseContext,&(this->super_HlslTokenStream).token,
                "attributes don\'t apply to control declaration","","");
    }
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
    if (bVar1) {
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
    }
    else {
      local_e8.field_2.string = (TString *)0x0;
      local_e8.loc.name = (TString *)0x0;
      local_e8.loc.string = 0;
      local_e8.loc.line = 0;
      local_e8.loc.column = 0;
      bVar1 = acceptIdentifier(this,&local_e8);
      if (bVar1) {
        local_110 = (TIntermTyped *)0x0;
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
        if (bVar1) {
          bVar1 = acceptExpression(this,&local_110);
          this_00 = this->parseContext;
          if (bVar1) {
            pTVar2 = HlslParseContext::declareVariable
                               (this_00,&local_e8.loc,local_e8.field_2.string,&local_b8,local_110);
            *node = pTVar2;
            return true;
          }
          pp_Var4 = (this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar3 = "initializer";
        }
        else {
          this_00 = this->parseContext;
          pp_Var4 = (this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar3 = "=";
        }
      }
      else {
        this_00 = this->parseContext;
        pp_Var4 = (this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar3 = "identifier";
      }
      (*pp_Var4[0x2d])(this_00,&(this->super_HlslTokenStream).token,"Expected",pcVar3,"");
    }
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptControlDeclaration(TIntermNode*& node)
{
    node = nullptr;
    TAttributes attributes;

    // fully_specified_type
    TType type;
    if (! acceptFullySpecifiedType(type, attributes))
        return false;

    if (attributes.size() > 0)
        parseContext.warn(token.loc, "attributes don't apply to control declaration", "", "");

    // filter out type casts
    if (peekTokenClass(EHTokLeftParen)) {
        recedeToken();
        return false;
    }

    // identifier
    HlslToken idToken;
    if (! acceptIdentifier(idToken)) {
        expected("identifier");
        return false;
    }

    // EQUAL
    TIntermTyped* expressionNode = nullptr;
    if (! acceptTokenClass(EHTokAssign)) {
        expected("=");
        return false;
    }

    // expression
    if (! acceptExpression(expressionNode)) {
        expected("initializer");
        return false;
    }

    node = parseContext.declareVariable(idToken.loc, *idToken.string, type, expressionNode);

    return true;
}